

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_draw_list_path_curve_to
               (nk_draw_list *list,nk_vec2 p2,nk_vec2 p3,nk_vec2 p4,uint num_segments)

{
  undefined8 uVar1;
  nk_vec2 pos;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  float local_28;
  float fStack_24;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x2723,
                  "void nk_draw_list_path_curve_to(struct nk_draw_list *, struct nk_vec2, struct nk_vec2, struct nk_vec2, unsigned int)"
                 );
  }
  if (list->path_count != 0) {
    uVar3 = num_segments + (num_segments == 0);
    pvVar2 = nk_buffer_memory(list->buffer);
    uVar1 = *(undefined8 *)
             ((long)pvVar2 + (ulong)(list->path_count - 1) * 8 + (ulong)list->path_offset);
    for (uVar4 = 1; uVar4 <= uVar3; uVar4 = uVar4 + 1) {
      fVar6 = (float)uVar4 * (1.0 / (float)uVar3);
      fVar7 = 1.0 - fVar6;
      fVar5 = fVar7 * fVar7 * fVar7;
      fVar8 = fVar7 * fVar7 * 3.0 * fVar6;
      fVar7 = fVar7 * 3.0 * fVar6 * fVar6;
      fVar6 = fVar6 * fVar6 * fVar6;
      local_48 = p2.x;
      fStack_44 = p2.y;
      local_58 = (float)uVar1;
      fStack_54 = (float)((ulong)uVar1 >> 0x20);
      local_38 = p3.x;
      fStack_34 = p3.y;
      local_28 = p4.x;
      fStack_24 = p4.y;
      pos.y = fVar6 * fStack_24 + fVar7 * fStack_34 + fVar5 * fStack_54 + fVar8 * fStack_44;
      pos.x = fVar6 * local_28 + fVar7 * local_38 + fVar5 * local_58 + fVar8 * local_48;
      nk_draw_list_path_line_to(list,pos);
    }
    return;
  }
  __assert_fail("list->path_count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x2724,
                "void nk_draw_list_path_curve_to(struct nk_draw_list *, struct nk_vec2, struct nk_vec2, struct nk_vec2, unsigned int)"
               );
}

Assistant:

NK_API void
nk_draw_list_path_curve_to(struct nk_draw_list *list, struct nk_vec2 p2,
    struct nk_vec2 p3, struct nk_vec2 p4, unsigned int num_segments)
{
    float t_step;
    unsigned int i_step;
    struct nk_vec2 p1;

    NK_ASSERT(list);
    NK_ASSERT(list->path_count);
    if (!list || !list->path_count) return;
    num_segments = NK_MAX(num_segments, 1);

    p1 = nk_draw_list_path_last(list);
    t_step = 1.0f/(float)num_segments;
    for (i_step = 1; i_step <= num_segments; ++i_step) {
        float t = t_step * (float)i_step;
        float u = 1.0f - t;
        float w1 = u*u*u;
        float w2 = 3*u*u*t;
        float w3 = 3*u*t*t;
        float w4 = t * t *t;
        float x = w1 * p1.x + w2 * p2.x + w3 * p3.x + w4 * p4.x;
        float y = w1 * p1.y + w2 * p2.y + w3 * p3.y + w4 * p4.y;
        nk_draw_list_path_line_to(list, nk_vec2(x,y));
    }
}